

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_map<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
::try_emplace_impl_with_hash<int_const&>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_map<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
          *this,size_t hashval,int *k)

{
  slot_type *psVar1;
  ctrl_t *pcVar2;
  size_t sVar3;
  UniqueLock m;
  tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
  res;
  UniqueLock local_50;
  tuple<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
  local_40;
  
  local_50.m_ = (mutex_type *)0x0;
  local_50.locked_ = false;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::find_or_prepare_insert_with_hash<int>
            (&local_40,
             (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
              *)this,hashval,k,&local_50);
  if (local_40.
      super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
      .super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Tuple_impl<2UL,_bool>.
      super__Head_base<2UL,_bool,_false>._M_head_impl == true) {
    psVar1 = ((local_40.
               super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
               .
               super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_false>
              ._M_head_impl)->set_).slots_;
    psVar1[local_40.
           super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
           .super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Head_base<1UL,_unsigned_long,_false>.
           _M_head_impl].value.first = *k;
    *(undefined4 *)
     ((long)psVar1 +
     local_40.
     super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
     .super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Head_base<1UL,_unsigned_long,_false>.
     _M_head_impl * 8 + 4) = 0;
    raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
    ::set_ctrl(&(local_40.
                 super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
                 .
                 super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_false>
                ._M_head_impl)->set_,
               local_40.
               super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
               .super__Tuple_impl<1UL,_unsigned_long,_bool>.
               super__Head_base<1UL,_unsigned_long,_false>._M_head_impl,(byte)hashval & 0x7f);
  }
  pcVar2 = ((local_40.
             super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
             .
             super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_false>
            ._M_head_impl)->set_).ctrl_;
  psVar1 = ((local_40.
             super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
             .
             super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_false>
            ._M_head_impl)->set_).slots_;
  sVar3 = ((local_40.
            super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
            .
            super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_false>
           ._M_head_impl)->set_).capacity_;
  (__return_storage_ptr__->first).inner_ =
       local_40.
       super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
       .
       super__Head_base<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_false>
       ._M_head_impl;
  (__return_storage_ptr__->first).inner_end_ = (Inner *)(this + 0x700);
  (__return_storage_ptr__->first).it_.ctrl_ =
       pcVar2 + local_40.
                super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
                .super__Tuple_impl<1UL,_unsigned_long,_bool>.
                super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
  (__return_storage_ptr__->first).it_.field_1.slot_ =
       psVar1 + local_40.
                super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
                .super__Tuple_impl<1UL,_unsigned_long,_bool>.
                super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
  (__return_storage_ptr__->first).it_end_.ctrl_ = pcVar2 + sVar3;
  __return_storage_ptr__->second =
       (bool)local_40.
             super__Tuple_impl<0UL,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::Inner_*,_unsigned_long,_bool>
             .super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Tuple_impl<2UL,_bool>.
             super__Head_base<2UL,_bool,_false>._M_head_impl;
  if (local_50.locked_ == true) {
    pthread_mutex_unlock((pthread_mutex_t *)local_50.m_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl_with_hash(size_t hashval, K&& k, Args&&... args) {
        UniqueLock m;
        auto res = this->find_or_prepare_insert_with_hash(hashval, k, m);
        typename Base::Inner *inner = std::get<0>(res);
        if (std::get<2>(res)) {
            inner->set_.emplace_at(std::get<1>(res), std::piecewise_construct,
                                   std::forward_as_tuple(std::forward<K>(k)),
                                   std::forward_as_tuple(std::forward<Args>(args)...));
            inner->set_.set_ctrl(std::get<1>(res), H2(hashval));
        }
        return {this->iterator_at(inner, inner->set_.iterator_at(std::get<1>(res))), 
                std::get<2>(res)};
    }